

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O2

void do_quaff(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  CClass *pCVar2;
  OBJ_DATA *obj;
  int nTimer;
  char *txt;
  allocator<char> local_12a2;
  allocator<char> local_12a1;
  CHAR_DATA *ch_local;
  string local_1298;
  string local_1278;
  string local_1258;
  string local_1238;
  char arg [4608];
  
  ch_local = ch;
  one_argument(argument,arg);
  bVar1 = is_npc(ch);
  if (bVar1) {
LAB_002be4fc:
    nTimer = 2;
  }
  else {
    pCVar2 = char_data::Class(ch);
    bVar1 = RString::operator==(&pCVar2->name,"necromancer");
    nTimer = 1;
    if (!bVar1) {
      pCVar2 = char_data::Class(ch_local);
      bVar1 = RString::operator==(&pCVar2->name,"sorcerer");
      if (!bVar1) {
        pCVar2 = char_data::Class(ch_local);
        bVar1 = RString::operator==(&pCVar2->name,"anti-paladin");
        if (!bVar1) goto LAB_002be4fc;
      }
    }
  }
  if (arg[0] == '\0') {
    obj = get_eq_char(ch_local,0x11);
    if ((obj != (OBJ_DATA *)0x0) && (obj->item_type == 10)) {
      act("$n quaffs $p in one large gulp.",ch_local,obj,(void *)0x0,0);
      act("You quaff the contents of $p in one large gulp.",ch_local,obj,(void *)0x0,3);
      bVar1 = check_deny_magic(ch_local);
      if (!bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1238,"do_quaff",&local_12a1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1258,"quaff_potion",&local_12a2);
        CQueue::AddToQueue<void(*)(char_data*,int,int,int,int),char_data*&,int&,int&,int&,int&>
                  (&RS.Queue,nTimer,&local_1238,&local_1258,quaff_potion,&ch_local,obj->value,
                   obj->value + 1,obj->value + 2,obj->value + 3);
        std::__cxx11::string::~string((string *)&local_1258);
        std::__cxx11::string::~string((string *)&local_1238);
      }
LAB_002be7b8:
      extract_obj(obj);
      return;
    }
    txt = "Quaff what?\n\r";
  }
  else {
    obj = get_obj_carry(ch_local,arg,ch_local);
    if (obj == (OBJ_DATA *)0x0) {
      txt = "You do not have that potion.\n\r";
    }
    else if (obj->item_type == 10) {
      if (ch_local->fighting == (CHAR_DATA *)0x0) {
        act("$n quaffs $p in one large gulp.",ch_local,obj,(void *)0x0,0);
        act("You quaff the contents of $p in one large gulp.",ch_local,obj,(void *)0x0,3);
        bVar1 = check_deny_magic(ch_local);
        if (!bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1278,"do_quaff",&local_12a1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1298,"quaff_potion",&local_12a2);
          CQueue::AddToQueue<void(*)(char_data*,int,int,int,int),char_data*&,int&,int&,int&,int&>
                    (&RS.Queue,nTimer,&local_1278,&local_1298,quaff_potion,&ch_local,obj->value,
                     obj->value + 1,obj->value + 2,obj->value + 3);
          std::__cxx11::string::~string((string *)&local_1298);
          std::__cxx11::string::~string((string *)&local_1278);
        }
        goto LAB_002be7b8;
      }
      txt = "You\'re too busy fighting to quaff.\n\r";
    }
    else {
      txt = "You can quaff only potions.\n\r";
    }
  }
  send_to_char(txt,ch_local);
  return;
}

Assistant:

void do_quaff(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	OBJ_DATA *obj;
	int nDelay = 0;

	one_argument(argument, arg);

	if (!is_npc(ch)
		&& (ch->Class()->name == "necromancer" || ch->Class()->name == "sorcerer" || ch->Class()->name == "anti-paladin"))
	{
		nDelay = 1;
	}
	else
	{
		nDelay = 2;
	}

	/* Can quaff held potions, even in combat! -- Eladrian */

	if (arg[0] == '\0')
	{
		obj = get_eq_char(ch, WEAR_HOLD);

		if (obj != nullptr)
		{
			if (obj->item_type == ITEM_POTION)
			{
				act("$n quaffs $p in one large gulp.", ch, obj, nullptr, TO_ROOM);
				act("You quaff the contents of $p in one large gulp.", ch, obj, nullptr, TO_CHAR);
	
				if (!check_deny_magic(ch))
				{
					RS.Queue.AddToQueue(nDelay,
						"do_quaff",
						"quaff_potion",
						quaff_potion,
						ch,
						obj->value[0],
						obj->value[1],
						obj->value[2],
						obj->value[3]);
				}

				extract_obj(obj);
				return;
			}
		}

		send_to_char("Quaff what?\n\r", ch);
		return;
	}

	obj = get_obj_carry(ch, arg, ch);

	if (obj == nullptr)
	{
		send_to_char("You do not have that potion.\n\r", ch);
		return;
	}

	if (obj->item_type != ITEM_POTION)
	{
		send_to_char("You can quaff only potions.\n\r", ch);
		return;
	}

	if (ch->fighting != nullptr)
	{
		send_to_char("You're too busy fighting to quaff.\n\r", ch);
		return;
	}

	act("$n quaffs $p in one large gulp.", ch, obj, nullptr, TO_ROOM);
	act("You quaff the contents of $p in one large gulp.", ch, obj, nullptr, TO_CHAR);

	if (!check_deny_magic(ch))
	{
		RS.Queue.AddToQueue(nDelay,
			"do_quaff",
			"quaff_potion",
			quaff_potion,
			ch,
			obj->value[0],
			obj->value[1],
			obj->value[2],
			obj->value[3]);
	}

	extract_obj(obj);
}